

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O1

bool __thiscall
Lowerer::TryLowerNewScObjectWithFixedCtorCache
          (Lowerer *this,Instr *newObjInstr,RegOpnd *newObjDst,LabelInstr *helperOrBailoutLabel,
          LabelInstr *callCtorLabel,bool *skipNewScObj,bool *returnNewScObj,bool *emitBailOut)

{
  code *pcVar1;
  bool bVar2;
  int16 iVar3;
  PropertyIndex PVar4;
  uint uVar5;
  uint uVar6;
  BailOutKind BVar7;
  JITTimeFunctionBody *pJVar8;
  FunctionJITTimeInfo *pFVar9;
  undefined4 *puVar10;
  JITTimeConstructorCache *this_00;
  AddrOpnd *pAVar11;
  intptr_t iVar12;
  MemRefOpnd *compareSrc1;
  FixedFieldInfo *this_01;
  JITType *pJVar13;
  JITTypeHandler *this_02;
  BranchInstr *instr;
  char16 *pcVar14;
  char16 *pcVar15;
  char16 *pcVar16;
  Func *pFVar17;
  char16_t *pcVar18;
  JITTypeHolderBase<void> local_a8;
  char16 debugStringBuffer [42];
  
  *skipNewScObj = false;
  *returnNewScObj = false;
  pJVar8 = JITTimeWorkItem::GetJITFunctionBody(newObjInstr->m_func->m_workItem);
  uVar5 = JITTimeFunctionBody::GetSourceContextId(pJVar8);
  pFVar9 = JITTimeWorkItem::GetJITTimeInfo(newObjInstr->m_func->m_workItem);
  uVar6 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar9);
  bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_015bbe90,FixedNewObjPhase,uVar5,uVar6);
  if (bVar2) {
    pJVar8 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
    uVar5 = JITTimeFunctionBody::GetSourceContextId(pJVar8);
    pFVar9 = JITTimeWorkItem::GetJITTimeInfo(this->m_func->m_workItem);
    uVar6 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar9);
    bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_015bbe90,ObjTypeSpecNewObjPhase,uVar5,uVar6);
    if (!bVar2) goto LAB_005cc082;
LAB_005cc07a:
    bVar2 = false;
  }
  else {
LAB_005cc082:
    if (((newObjInstr->field_0x38 & 0x10) == 0) ||
       (BVar7 = IR::Instr::GetBailOutKindNoBits(newObjInstr), BVar7 != BailOutFailedCtorGuardCheck))
    {
      if (newObjInstr->m_opcode == NewScObjArray) {
        return false;
      }
      if (newObjInstr->m_opcode == NewScObjArraySpread) {
        return false;
      }
      if (newObjInstr->m_kind == InstrKindProfiled) {
        this_00 = Func::GetConstructorCache
                            (newObjInstr->m_func,*(ProfileId *)&newObjInstr[1]._vptr_Instr);
      }
      else {
        this_00 = (JITTimeConstructorCache *)0x0;
      }
      if (this_00 == (JITTimeConstructorCache *)0x0) {
        pJVar8 = JITTimeWorkItem::GetJITFunctionBody(newObjInstr->m_func->m_workItem);
        uVar5 = JITTimeFunctionBody::GetSourceContextId(pJVar8);
        pFVar9 = JITTimeWorkItem::GetJITTimeInfo(newObjInstr->m_func->m_workItem);
        uVar6 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar9);
        bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_015cd718,FixedNewObjPhase,uVar5,uVar6);
        if (bVar2) {
LAB_005cc84b:
          pJVar8 = JITTimeWorkItem::GetJITFunctionBody(newObjInstr->m_func->m_workItem);
          pcVar14 = JITTimeFunctionBody::GetDisplayName(pJVar8);
          pFVar9 = JITTimeWorkItem::GetJITTimeInfo(newObjInstr->m_func->m_workItem);
          pcVar15 = FunctionJITTimeInfo::GetDebugNumberSet(pFVar9,(wchar (*) [42])&local_a8);
          pcVar16 = Js::OpCodeUtil::GetOpCodeName(newObjInstr->m_opcode);
          pcVar18 = L"instruction is not profiled";
          if (newObjInstr->m_kind == InstrKindProfiled) {
            pcVar18 = L"constructor cache hasn\'t been cloned";
          }
          Output::Print(L"FixedNewObj: function %s (%s): lowering non-fixed new script object for %s, because %s.\n"
                        ,pcVar14,pcVar15,pcVar16,pcVar18);
          Output::Flush();
          return false;
        }
        pJVar8 = JITTimeWorkItem::GetJITFunctionBody(newObjInstr->m_func->m_workItem);
        uVar5 = JITTimeFunctionBody::GetSourceContextId(pJVar8);
        pFVar9 = JITTimeWorkItem::GetJITTimeInfo(newObjInstr->m_func->m_workItem);
        uVar6 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar9);
        bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_015d3490,FixedNewObjPhase,uVar5,uVar6);
        if (bVar2) goto LAB_005cc84b;
        goto LAB_005cc07a;
      }
    }
    else {
      if ((newObjInstr->m_opcode != NewScObject) && (newObjInstr->m_opcode != NewScObjectNoCtor)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar10 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x12eb,"(newObjInstr->IsNewScObjectInstr())",
                           "newObjInstr->IsNewScObjectInstr()");
        if (!bVar2) goto LAB_005cc8c5;
        *puVar10 = 0;
      }
      if (newObjInstr->m_kind != InstrKindProfiled) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar10 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x12ec,"(newObjInstr->IsProfiledInstr())",
                           "newObjInstr->IsProfiledInstr()");
        if (!bVar2) goto LAB_005cc8c5;
        *puVar10 = 0;
      }
      BVar7 = IR::Instr::GetBailOutKind(newObjInstr);
      if (BVar7 != BailOutFailedCtorGuardCheck) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar10 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x12ed,
                           "(newObjInstr->GetBailOutKind() == IR::BailOutFailedCtorGuardCheck)",
                           "newObjInstr->GetBailOutKind() == IR::BailOutFailedCtorGuardCheck");
        if (!bVar2) goto LAB_005cc8c5;
        *puVar10 = 0;
      }
      *emitBailOut = true;
      pFVar17 = newObjInstr->m_func;
      if (newObjInstr->m_kind != InstrKindProfiled) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar10 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                           ,0xd5,"(this->IsProfiledInstr())","Bad call to AsProfiledInstr()");
        if (!bVar2) goto LAB_005cc8c5;
        *puVar10 = 0;
      }
      this_00 = Func::GetConstructorCache(pFVar17,*(ProfileId *)&newObjInstr[1]._vptr_Instr);
      if (this_00 == (JITTimeConstructorCache *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar10 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x12f2,"(ctorCache != nullptr)","ctorCache != nullptr");
        if (!bVar2) goto LAB_005cc8c5;
        *puVar10 = 0;
      }
      bVar2 = JITTimeConstructorCache::SkipNewScObject(this_00);
      if (bVar2) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar10 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x12f3,"(!ctorCache->SkipNewScObject())","!ctorCache->SkipNewScObject()"
                          );
        if (!bVar2) goto LAB_005cc8c5;
        *puVar10 = 0;
      }
      bVar2 = JITTimeConstructorCache::IsTypeFinal(this_00);
      if ((bVar2) &&
         (bVar2 = JITTimeConstructorCache::CtorHasNoExplicitReturnValue(this_00), !bVar2)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar10 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x12f4,
                           "(!ctorCache->IsTypeFinal() || ctorCache->CtorHasNoExplicitReturnValue())"
                           ,"!ctorCache->IsTypeFinal() || ctorCache->CtorHasNoExplicitReturnValue()"
                          );
        if (!bVar2) goto LAB_005cc8c5;
        *puVar10 = 0;
      }
      LinkCtorCacheToGuardedProperties(this,this_00);
    }
    bVar2 = JITTimeConstructorCache::SkipNewScObject(this_00);
    if (bVar2) {
      if (*emitBailOut == true) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar10 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x1330,"(!emitBailOut)",
                           "Can\'t bail out on constructor cache guard for built-in constructors.");
        if (!bVar2) {
LAB_005cc8c5:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar10 = 0;
      }
      *skipNewScObj = true;
      pAVar11 = IR::AddrOpnd::NewNull(this->m_func);
      InsertMove(&newObjDst->super_Opnd,&pAVar11->super_Opnd,newObjInstr,true);
    }
    else {
      local_a8.t = (Type)JITTimeConstructorCache::GetType(this_00);
      stack0xffffffffffffffb0 = 0;
      bVar2 = JITTypeHolderBase<void>::operator!=(&local_a8,(nullptr_t *)(debugStringBuffer + 0x28))
      ;
      if (!bVar2) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar10 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x1338,"(ctorCache->GetType() != nullptr)",
                           "Why did we hard-code a mismatched, invalidated or polymorphic constructor cache?"
                          );
        if (!bVar2) goto LAB_005cc8c5;
        *puVar10 = 0;
      }
      bVar2 = JITTimeConstructorCache::CtorHasNoExplicitReturnValue(this_00);
      *returnNewScObj = bVar2;
      iVar12 = JITTimeConstructorCache::GetRuntimeCacheGuardAddr(this_00);
      compareSrc1 = IR::MemRefOpnd::New(iVar12,TyInt64,this->m_func,AddrOpndKindDynamicGuardValueRef
                                       );
      pFVar17 = this->m_func;
      pAVar11 = IR::AddrOpnd::NewNull(pFVar17);
      InsertCompareBranch((Lowerer *)pFVar17,&compareSrc1->super_Opnd,&pAVar11->super_Opnd,BrEq_A,
                          false,helperOrBailoutLabel,newObjInstr,false);
      this_01 = IR::Instr::GetFixedFunction(newObjInstr);
      bVar2 = FixedFieldInfo::IsClassCtor(this_01);
      if (bVar2) {
        InsertMove(&newObjDst->super_Opnd,newObjInstr->m_src1,newObjInstr,true);
      }
      else {
        local_a8.t = (Type)JITTimeConstructorCache::GetType(this_00);
        pJVar13 = JITTypeHolderBase<void>::operator->(&local_a8);
        bVar2 = JITType::IsShared(pJVar13);
        if (!bVar2) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar10 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                             ,0x136d,"(newObjectType->IsShared())","newObjectType->IsShared()");
          if (!bVar2) goto LAB_005cc8c5;
          *puVar10 = 0;
        }
        pJVar13 = JITTypeHolderBase<void>::operator->(&local_a8);
        iVar12 = JITType::GetAddr(pJVar13);
        pAVar11 = IR::AddrOpnd::New(iVar12,AddrOpndKindDynamicType,this->m_func,false,(Var)0x0);
        iVar3 = JITTimeConstructorCache::GetInlineSlotCount(this_00);
        uVar6 = (uint)iVar3;
        uVar5 = JITTimeConstructorCache::GetSlotCount(this_00);
        pJVar13 = JITTypeHolderBase<void>::operator->(&local_a8);
        this_02 = JITType::GetTypeHandler(pJVar13);
        bVar2 = JITTypeHandler::IsObjectHeaderInlinedTypeHandler(this_02);
        if (bVar2) {
          PVar4 = Js::DynamicTypeHandler::GetObjectHeaderInlinableSlotCapacity();
          if ((int)uVar6 < (int)(uint)PVar4) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar10 = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                               ,0x1378,
                               "(inlineSlotSize >= Js::DynamicTypeHandler::GetObjectHeaderInlinableSlotCapacity())"
                               ,
                               "inlineSlotSize >= Js::DynamicTypeHandler::GetObjectHeaderInlinableSlotCapacity()"
                              );
            if (!bVar2) goto LAB_005cc8c5;
            *puVar10 = 0;
          }
          if (uVar5 != uVar6) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar10 = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                               ,0x1379,"(inlineSlotSize == slotSize)","inlineSlotSize == slotSize");
            if (!bVar2) goto LAB_005cc8c5;
            *puVar10 = 0;
          }
          PVar4 = Js::DynamicTypeHandler::GetObjectHeaderInlinableSlotCapacity();
          uVar6 = uVar6 - PVar4;
          uVar5 = uVar6;
        }
        GenerateDynamicObjectAlloc(this,newObjInstr,uVar6,uVar5,newObjDst,&pAVar11->super_Opnd);
      }
      instr = IR::BranchInstr::New(JMP,callCtorLabel,this->m_func);
      IR::Instr::InsertBefore(newObjInstr,&instr->super_Instr);
    }
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

bool Lowerer::TryLowerNewScObjectWithFixedCtorCache(IR::Instr* newObjInstr, IR::RegOpnd* newObjDst,
    IR::LabelInstr* helperOrBailoutLabel, IR::LabelInstr* callCtorLabel, bool& skipNewScObj, bool& returnNewScObj, bool& emitBailOut)
{
    skipNewScObj = false;
    returnNewScObj = false;

    if (PHASE_OFF(Js::FixedNewObjPhase, newObjInstr->m_func) && PHASE_OFF(Js::ObjTypeSpecNewObjPhase, this->m_func))
    {
        return false;
    }

    JITTimeConstructorCache * ctorCache;

    if (newObjInstr->HasBailOutInfo() && newObjInstr->GetBailOutKindNoBits() == IR::BailOutFailedCtorGuardCheck)
    {
        Assert(newObjInstr->IsNewScObjectInstr());
        Assert(newObjInstr->IsProfiledInstr());
        Assert(newObjInstr->GetBailOutKind() == IR::BailOutFailedCtorGuardCheck);

        emitBailOut = true;

        ctorCache = newObjInstr->m_func->GetConstructorCache(static_cast<Js::ProfileId>(newObjInstr->AsProfiledInstr()->u.profileId));
        Assert(ctorCache != nullptr);
        Assert(!ctorCache->SkipNewScObject());
        Assert(!ctorCache->IsTypeFinal() || ctorCache->CtorHasNoExplicitReturnValue());

        LinkCtorCacheToGuardedProperties(ctorCache);
    }
    else
    {
        if (newObjInstr->m_opcode == Js::OpCode::NewScObjArray || newObjInstr->m_opcode == Js::OpCode::NewScObjArraySpread)
        {
            // These instr's carry a profile that indexes the array call site info, not the ctor cache.
            return false;
        }

        ctorCache = newObjInstr->IsProfiledInstr() ? newObjInstr->m_func->GetConstructorCache(static_cast<Js::ProfileId>(newObjInstr->AsProfiledInstr()->u.profileId)) : nullptr;

        if (ctorCache == nullptr)
        {
            if (PHASE_TRACE(Js::FixedNewObjPhase, newObjInstr->m_func) || PHASE_TESTTRACE(Js::FixedNewObjPhase, newObjInstr->m_func))
            {
                char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
                Output::Print(_u("FixedNewObj: function %s (%s): lowering non-fixed new script object for %s, because %s.\n"),
                    newObjInstr->m_func->GetJITFunctionBody()->GetDisplayName(), newObjInstr->m_func->GetDebugNumberSet(debugStringBuffer), Js::OpCodeUtil::GetOpCodeName(newObjInstr->m_opcode),
                    newObjInstr->IsProfiledInstr() ? _u("constructor cache hasn't been cloned") : _u("instruction is not profiled"));
                Output::Flush();
            }

            return false;
        }
    }

    Assert(ctorCache != nullptr);

    // We should only have cloned if the script contexts match.
    // TODO: oop jit, add ctorCache->scriptContext for tracing assert
    // Assert(newObjInstr->m_func->GetScriptContextInfo()->GetAddr() == ctorCache->scriptContext);

    // Built-in constructors don't need a default new object.  Since we know which constructor we're calling, we can skip creating a default
    // object and call a specialized helper (or even constructor, directly) avoiding the checks in generic NewScObjectCommon.
    if (ctorCache->SkipNewScObject())
    {
#if 0 // TODO: oop jit, add constructor info for tracing
        if (PHASE_TRACE(Js::FixedNewObjPhase, newObjInstr->m_func) || PHASE_TESTTRACE(Js::FixedNewObjPhase, newObjInstr->m_func))
        {
            const Js::JavascriptFunction* ctor = ctorCache->constructor;
            Js::FunctionBody* ctorBody = ctor->GetFunctionInfo()->HasBody() ? ctor->GetFunctionInfo()->GetFunctionBody() : nullptr;
            const char16* ctorName = ctorBody != nullptr ? ctorBody->GetDisplayName() : _u("<unknown>");

            char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
            char16 debugStringBuffer2[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];

            Output::Print(_u("FixedNewObj: function %s (%s): lowering skipped new script object for %s with %s ctor <unknown> (%s %s).\n"),
                newObjInstr->m_func->GetJITFunctionBody()->GetDisplayName(), newObjInstr->m_func->GetDebugNumberSet(debugStringBuffer2), Js::OpCodeUtil::GetOpCodeName(newObjInstr->m_opcode),
                newObjInstr->m_opcode == Js::OpCode::NewScObjectNoCtor ? _u("inlined") : _u("called"),
                ctorName, ctorBody ? ctorBody->GetDebugNumberSet(debugStringBuffer) : _u("(null)"));
            Output::Flush();
        }
#endif

        // All built-in constructors share a special singleton cache that is never checked and never invalidated.  It cannot be used
        // as a guard to protect any property operations downstream from the constructor.  If this ever becomes a performance issue,
        // we could have a dedicated cache for each built-in constructor, populate it and invalidate it as any other constructor cache.
        AssertMsg(!emitBailOut, "Can't bail out on constructor cache guard for built-in constructors.");

        skipNewScObj = true;
        IR::AddrOpnd* zeroOpnd = IR::AddrOpnd::NewNull(this->m_func);
        this->InsertMove(newObjDst, zeroOpnd, newObjInstr);
        return true;
    }

    AssertMsg(ctorCache->GetType() != nullptr, "Why did we hard-code a mismatched, invalidated or polymorphic constructor cache?");

#if 0 // TODO: oop jit, add constructor info for tracing
    if (PHASE_TRACE(Js::FixedNewObjPhase, newObjInstr->m_func) || PHASE_TESTTRACE(Js::FixedNewObjPhase, newObjInstr->m_func))
    {
        const Js::JavascriptFunction* constructor = ctorCache->constructor;
        Js::FunctionBody* constructorBody = constructor->GetFunctionInfo()->HasBody() ? constructor->GetFunctionInfo()->GetFunctionBody() : nullptr;
        const char16* constructorName = constructorBody != nullptr ? constructorBody->GetDisplayName() : _u("<unknown>");

        char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
        char16 debugStringBuffer2[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];

        if (PHASE_TRACE(Js::FixedNewObjPhase, newObjInstr->m_func))
        {
            Output::Print(_u("FixedNewObj: function %s (%s): lowering fixed new script object for %s with %s ctor <unknown> (%s %s): type = %p, slots = %d, inlined slots = %d.\n"),
                newObjInstr->m_func->GetJITFunctionBody()->GetDisplayName(), newObjInstr->m_func->GetDebugNumberSet(debugStringBuffer2), Js::OpCodeUtil::GetOpCodeName(newObjInstr->m_opcode),
                newObjInstr->m_opcode == Js::OpCode::NewScObjectNoCtor ? _u("inlined") : _u("called"),
                constructorName, constructorBody ? constructorBody->GetDebugNumberSet(debugStringBuffer) : _u("(null)"),
                ctorCache->type, ctorCache->slotCount, ctorCache->inlineSlotCount);
        }
        else
        {
            Output::Print(_u("FixedNewObj: function %s (%s): lowering fixed new script object for %s with %s ctor <unknown> (%s %s): slots = %d, inlined slots = %d.\n"),
                newObjInstr->m_func->GetJITFunctionBody()->GetDisplayName(), newObjInstr->m_func->GetDebugNumberSet(debugStringBuffer2), Js::OpCodeUtil::GetOpCodeName(newObjInstr->m_opcode),
                newObjInstr->m_opcode == Js::OpCode::NewScObjectNoCtor ? _u("inlined") : _u("called"),
                constructorName, debugStringBuffer, ctorCache->slotCount, ctorCache->inlineSlotCount);
        }
        Output::Flush();
    }
#endif

    // If the constructor has no return statements, we can safely return the object that was created here.
    // No need to check what the constructor returned - it must be undefined.
    returnNewScObj = ctorCache->CtorHasNoExplicitReturnValue();

    Assert(Js::ConstructorCache::GetSizeOfGuardValue() == static_cast<size_t>(TySize[TyMachPtr]));
    IR::MemRefOpnd* guardOpnd = IR::MemRefOpnd::New(ctorCache->GetRuntimeCacheGuardAddr(), TyMachReg, this->m_func,
        IR::AddrOpndKindDynamicGuardValueRef);
    IR::AddrOpnd* zeroOpnd = IR::AddrOpnd::NewNull(this->m_func);
    InsertCompareBranch(guardOpnd, zeroOpnd, Js::OpCode::BrEq_A, helperOrBailoutLabel, newObjInstr);

    // If we are calling new on a class constructor, the contract is that we pass new.target as the 'this' argument.
    // function is the constructor on which we called new - which is new.target.
    FixedFieldInfo* ctor = newObjInstr->GetFixedFunction();

    if (ctor->IsClassCtor())
    {
        // MOV newObjDst, function
        this->InsertMove(newObjDst, newObjInstr->GetSrc1(), newObjInstr);
    }
    else
    {
        JITTypeHolder newObjectType(ctorCache->GetType());
        Assert(newObjectType->IsShared());

        IR::AddrOpnd* typeSrc = IR::AddrOpnd::New(newObjectType->GetAddr(), IR::AddrOpndKindDynamicType, m_func);

        // For the next call:
        //     inlineSlotSize == Number of slots to allocate beyond the DynamicObject header
        //     slotSize - inlineSlotSize == Number of aux slots to allocate
        int inlineSlotSize = ctorCache->GetInlineSlotCount();
        int slotSize = ctorCache->GetSlotCount();
        if (newObjectType->GetTypeHandler()->IsObjectHeaderInlinedTypeHandler())
        {
            Assert(inlineSlotSize >= Js::DynamicTypeHandler::GetObjectHeaderInlinableSlotCapacity());
            Assert(inlineSlotSize == slotSize);
            slotSize = inlineSlotSize -= Js::DynamicTypeHandler::GetObjectHeaderInlinableSlotCapacity();
        }
        GenerateDynamicObjectAlloc(newObjInstr, inlineSlotSize, slotSize, newObjDst, typeSrc);
    }

    // JMP $callCtor
    IR::BranchInstr *callCtorBranch = IR::BranchInstr::New(LowererMD::MDUncondBranchOpcode, callCtorLabel, m_func);
    newObjInstr->InsertBefore(callCtorBranch);

    return true;
}